

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O3

void si9ma::Trie::delete_str(TrieNode *root,string *str)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  TrieNode *pTVar5;
  int i;
  
  uVar2 = str->_M_string_length;
  if (uVar2 == 0) {
    if (root->end < 1) {
      return;
    }
    iVar1 = root->pass + -1;
    root->pass = iVar1;
  }
  else {
    uVar4 = 0;
    pTVar5 = root;
    do {
      pTVar5 = *(TrieNode **)((long)pTVar5 + (long)(str->_M_dataplus)._M_p[uVar4] * 8 + -0x300);
      if (pTVar5 == (TrieNode *)0x0) {
        return;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    if (pTVar5->end < 1) {
      return;
    }
    root->pass = root->pass + -1;
    uVar4 = 0;
    pTVar5 = root;
    do {
      lVar3 = (long)(str->_M_dataplus)._M_p[uVar4];
      root = *(TrieNode **)((long)pTVar5 + lVar3 * 8 + -0x300);
      root->pass = root->pass + -1;
      if (root->pass == 0) {
        *(undefined8 *)((long)pTVar5 + lVar3 * 8 + -0x300) = 0;
      }
      if (pTVar5->pass == 0) {
        TrieNode::~TrieNode(pTVar5);
        operator_delete(pTVar5);
        uVar2 = str->_M_string_length;
      }
      uVar4 = uVar4 + 1;
      pTVar5 = root;
    } while (uVar4 < uVar2);
    iVar1 = root->pass;
  }
  root->end = root->end + -1;
  if (iVar1 != 0) {
    return;
  }
  TrieNode::~TrieNode(root);
  operator_delete(root);
  return;
}

Assistant:

void Trie::delete_str(TrieNode *root,const string &str) {
        if (search(root,str) > 0) {
            root->pass--;
            auto *cur = root;
            auto *next = root;

            for (int i = 0; i < str.length(); ++i) {
                int index = str[i] - 'a';

                next = cur->nexts[index];

                // if next pass == 0,reset cur next ptr to null
                if (--cur->nexts[index]->pass == 0)
                    cur->nexts[index] = nullptr;

                // delete cur,if pass == 0
                if (cur->pass == 0)
                    delete cur;

                cur = next;
            }

            cur->end--;

            // delete last is pass == null
            if (cur->pass == 0)
                delete cur;
        }
    }